

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void ob_q_free(nghttp2_outbound_queue *q,nghttp2_mem *mem)

{
  nghttp2_mem *in_RDI;
  nghttp2_outbound_item *unaff_retaddr;
  nghttp2_outbound_item *next;
  nghttp2_outbound_item *item;
  void *in_stack_ffffffffffffffd8;
  nghttp2_mem *local_18;
  
  local_18 = (nghttp2_mem *)in_RDI->mem_user_data;
  while (local_18 != (nghttp2_mem *)0x0) {
    local_18 = (nghttp2_mem *)local_18[3].calloc;
    nghttp2_outbound_item_free(unaff_retaddr,in_RDI);
    nghttp2_mem_free(local_18,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void ob_q_free(nghttp2_outbound_queue *q, nghttp2_mem *mem) {
  nghttp2_outbound_item *item, *next;
  for (item = q->head; item;) {
    next = item->qnext;
    nghttp2_outbound_item_free(item, mem);
    nghttp2_mem_free(mem, item);
    item = next;
  }
}